

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::
     iuUniversalPrinter<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>_>::Print
               (tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int> *value,iu_ostream *os)

{
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  std::ostream::operator<<
            (os,(value->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                super__Head_base<0UL,_int,_false>._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  std::ostream::operator<<
            (os,(value->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
                super__Head_base<1UL,_int,_false>._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  std::ostream::operator<<
            (os,(value->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>).
                super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
                super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
                super__Head_base<2UL,_int,_false>._M_head_impl);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  PrintTupleElemTo<std::tuple<int,int,int,int,int,int,int,int,int,int>,7,10>
            (value,os,(type **)&iutest_type_traits::enabler_t<void>::value);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }